

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::baz(TestInterfaceImpl *this,BazContext context)

{
  Reader reader;
  CallContextHook *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  BazContext context_local;
  Runnable local_1f8;
  CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  *local_1f0;
  Reader local_1e8;
  Reader params;
  NullableValue<kj::Exception> local_188;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  context_local.hook = in_RDX;
  CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::getParams(&params,&context_local);
  capnproto_test::capnp::test::TestInterface::BazParams::Reader::getS(&local_1e8,&params);
  reader._reader.capTable = local_1e8._reader.capTable;
  reader._reader.segment = local_1e8._reader.segment;
  reader._reader.data = local_1e8._reader.data;
  reader._reader.pointers = local_1e8._reader.pointers;
  reader._reader.dataSize = local_1e8._reader.dataSize;
  reader._reader.pointerCount = local_1e8._reader.pointerCount;
  reader._reader._38_2_ = local_1e8._reader._38_2_;
  reader._reader.nestingLimit = local_1e8._reader.nestingLimit;
  reader._reader._44_4_ = local_1e8._reader._44_4_;
  checkTestMessage(reader);
  (*(context_local.hook)->_vptr_CallContextHook[1])();
  local_1f8._vptr_Runnable = (_func_int **)&PTR_run_00660ef8;
  local_1f0 = &context_local;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_188,&local_1f8);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_188);
  if ((local_188.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[88]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x388,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr\""
               ,(char (*) [88])
                "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr"
              );
  }
  kj::Promise<void>::Promise((Promise<void> *)this);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestInterfaceImpl::baz(BazContext context) {
  ++callCount;
  auto params = context.getParams();
  checkTestMessage(params.getS());
  context.releaseParams();
  EXPECT_ANY_THROW(context.getParams());

  return kj::READY_NOW;
}